

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubsub.hpp
# Opt level: O0

subscriber_pointer __thiscall
pstore::brokerface::channel<pstore::descriptor_condition_variable>::new_subscriber
          (channel<pstore::descriptor_condition_variable> *this)

{
  subscriber<pstore::descriptor_condition_variable> *this_00;
  channel<pstore::descriptor_condition_variable> *in_RSI;
  pointer local_48;
  not_null<pstore::brokerface::channel<pstore::descriptor_condition_variable>_*> local_40 [3];
  undefined1 local_21;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  channel<pstore::descriptor_condition_variable> *this_local;
  subscriber_pointer *resl;
  
  std::lock_guard<std::mutex>::lock_guard(&local_20,(mutex_type *)in_RSI);
  local_21 = 0;
  this_00 = (subscriber<pstore::descriptor_condition_variable> *)operator_new(0x60);
  pstore::gsl::not_null<pstore::brokerface::channel<pstore::descriptor_condition_variable>_*>::
  not_null(local_40,in_RSI);
  subscriber<pstore::descriptor_condition_variable>::subscriber(this_00,local_40[0]);
  std::
  unique_ptr<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>,std::default_delete<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>>>
  ::
  unique_ptr<std::default_delete<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>>,void>
            ((unique_ptr<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>,std::default_delete<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>>>
              *)this,this_00);
  local_48 = std::
             unique_ptr<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>,_std::default_delete<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_>_>
             ::get((unique_ptr<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>,_std::default_delete<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_>_>
                    *)this);
  std::
  unordered_set<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*,_std::hash<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*>,_std::equal_to<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*>,_std::allocator<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*>_>
  ::insert((unordered_set<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*,_std::hash<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*>,_std::equal_to<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*>,_std::allocator<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*>_>
            *)(in_RSI + 0x30),&local_48);
  local_21 = 1;
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return (__uniq_ptr_data<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>,_std::default_delete<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_>,_true,_true>
          )(__uniq_ptr_data<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>,_std::default_delete<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_>,_true,_true>
            )this;
}

Assistant:

auto channel<ConditionVariable>::new_subscriber () -> subscriber_pointer {
            std::lock_guard<std::mutex> const lock{mut_};
            auto resl = subscriber_pointer{new subscriber_type (this)};
            subscribers_.insert (resl.get ());
            return resl;
        }